

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_unvoiced_vowel.c
# Opt level: O3

void get_mora_information
               (NJDNode *node,int index,char **mora,NJDNode **nlink,int *flag,int *size,int *midx,
               int *atype)

{
  int i;
  int iVar1;
  char *__s;
  size_t sVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  char *pcVar6;
  
  __s = NJDNode_get_pron(node);
  sVar2 = strlen(__s);
  if ((int)sVar2 <= index) {
    do {
      node = node->next;
      if (node == (NJDNode *)0x0) {
        *mora = (char *)0x0;
        *nlink = (NJDNode *)0x0;
        *flag = -1;
        *size = 0;
        *midx = 0;
        *atype = 0;
        return;
      }
      index = index - (int)sVar2;
      __s = NJDNode_get_pron(node);
      sVar2 = strlen(__s);
    } while ((int)sVar2 <= index);
  }
  *nlink = node;
  if ((index == 0) && (iVar1 = NJDNode_get_chain_flag(node), iVar1 != 1)) {
    *midx = 0;
    iVar1 = NJDNode_get_acc(node);
    *atype = iVar1;
  }
  pcVar6 = anon_var_dwarf_2546;
  iVar1 = strcmp(__s,anon_var_dwarf_2546);
  if (iVar1 != 0) {
    pcVar6 = anon_var_dwarf_1d7c;
    iVar1 = strcmp(__s,anon_var_dwarf_1d7c);
    if (iVar1 != 0) {
      *mora = (char *)0x0;
      *flag = -1;
      *size = 0;
      lVar3 = 0;
      do {
        pcVar6 = njd_set_unvoiced_vowel_mora_list[lVar3];
        cVar5 = *pcVar6;
        if (cVar5 != '\0') {
          lVar4 = 0;
          do {
            if (__s[lVar4 + index] != cVar5) goto LAB_0014b8db;
            cVar5 = pcVar6[lVar4 + 1];
            lVar4 = lVar4 + 1;
          } while (cVar5 != '\0');
          if (0 < (int)lVar4) {
            *mora = pcVar6;
            *size = (int)lVar4;
            goto LAB_0014b92d;
          }
        }
LAB_0014b8db:
        lVar3 = lVar3 + 1;
        if (lVar3 == 0x9f) {
          lVar4 = 0;
LAB_0014b92d:
          cVar5 = -0x1e;
          lVar3 = 0;
          do {
            if (__s[lVar3 + ((int)lVar4 + index)] != cVar5) {
              return;
            }
            cVar5 = anon_var_dwarf_1b9c[lVar3 + 1];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          *flag = 1;
          *size = *size + 3;
          return;
        }
      } while( true );
    }
  }
  *mora = pcVar6;
  *flag = 0;
  *size = 3;
  return;
}

Assistant:

static void get_mora_information(NJDNode * node, int index, const char **mora, NJDNode ** nlink,
                                 int *flag, int *size, int *midx, int *atype)
{
   int i;
   int matched_size;
   const char *str = NJDNode_get_pron(node);
   int len = strlen(str);

   /* find next word */
   if (index >= len) {
      if (node->next != NULL) {
         get_mora_information(node->next, index - len, mora, nlink, flag, size, midx, atype);
      } else {
         *mora = NULL;
         *nlink = NULL;
         *flag = -1;
         *size = 0;
         *midx = 0;
         *atype = 0;
      }
      return;
   }

   *nlink = node;

   /* reset mora index and accent type for new word */
   if (index == 0 && NJDNode_get_chain_flag(node) != 1) {
      *midx = 0;
      *atype = NJDNode_get_acc(node);
   }

   /* special symbol */
   if (strcmp(str, NJD_SET_UNVOICED_VOWEL_TOUTEN) == 0) {
      *mora = NJD_SET_UNVOICED_VOWEL_TOUTEN;
      *flag = 0;
      *size = strlen(NJD_SET_UNVOICED_VOWEL_TOUTEN);
      return;
   }
   if (strcmp(str, NJD_SET_UNVOICED_VOWEL_QUESTION) == 0) {
      *mora = NJD_SET_UNVOICED_VOWEL_QUESTION;
      *flag = 0;
      *size = strlen(NJD_SET_UNVOICED_VOWEL_QUESTION);
      return;
   }

   /* reset */
   *mora = NULL;
   *flag = -1;
   *size = 0;

   /* get mora */
   for (i = 0; njd_set_unvoiced_vowel_mora_list[i] != NULL; i++) {
      matched_size = strtopcmp(&str[index], njd_set_unvoiced_vowel_mora_list[i]);
      if (matched_size > 0) {
         *mora = njd_set_unvoiced_vowel_mora_list[i];
         *size = matched_size;
         break;
      }
   }

   /* get unvoice flag */
   matched_size = strtopcmp(&str[index + (*size)], NJD_SET_UNVOICED_VOWEL_QUOTATION);
   if (matched_size > 0) {
      *flag = 1;
      *size += matched_size;
   }
}